

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmGlobalNinjaGenerator.cxx
# Opt level: O2

void __thiscall
cmGlobalNinjaGenerator::AppendTargetDependsClosure
          (cmGlobalNinjaGenerator *this,cmGeneratorTarget *target,
          unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
          *outputs,string *config,string *fileConfig,bool genexOutput,bool omit_self)

{
  map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
  *this_00;
  bool bVar1;
  mapped_type *pmVar2;
  iterator __pos;
  TargetDependSet *pTVar3;
  _Base_ptr p_Var4;
  string *config_00;
  cmNinjaDeps outs;
  TargetDependsClosureKey key;
  undefined1 local_98 [56];
  undefined1 local_60 [40];
  bool local_38;
  
  local_60._0_8_ = target;
  std::__cxx11::string::string((string *)(local_60 + 8),(string *)config);
  this_00 = &this->Configs;
  local_38 = genexOutput;
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](this_00,fileConfig);
  __pos = std::
          _Rb_tree<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>,_std::_Select1st<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>,_std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,_std::allocator<std::pair<const_cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,_std::unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>_>_>
          ::lower_bound(&(pmVar2->TargetDependsClosures)._M_t,(key_type *)local_60);
  pmVar2 = std::
           map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
           ::operator[](this_00,fileConfig);
  if (((_Rb_tree_header *)__pos._M_node ==
       &(pmVar2->TargetDependsClosures)._M_t._M_impl.super__Rb_tree_header) ||
     (bVar1 = ::operator!=((TargetDependsClosureKey *)(__pos._M_node + 1),
                           (TargetDependsClosureKey *)local_60), bVar1)) {
    local_98._0_8_ = local_98 + 0x30;
    local_98._8_8_ = (pointer)0x1;
    local_98._16_8_ = (_Hash_node_base *)0x0;
    local_98._24_8_ = 0;
    local_98._32_4_ = 1.0;
    local_98._40_8_ = 0;
    local_98._48_8_ = (__node_base_ptr)0x0;
    pTVar3 = cmGlobalGenerator::GetTargetDirectDepends((cmGlobalGenerator *)this,target);
    for (p_Var4 = (pTVar3->
                  super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>
                  )._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
        (_Rb_tree_header *)p_Var4 !=
        &(pTVar3->
         super_set<cmTargetDepend,_std::less<cmTargetDepend>,_std::allocator<cmTargetDepend>_>)._M_t
         ._M_impl.super__Rb_tree_header; p_Var4 = (_Base_ptr)std::_Rb_tree_increment(p_Var4)) {
      bVar1 = cmGeneratorTarget::IsInBuildSystem(*(cmGeneratorTarget **)(p_Var4 + 1));
      if ((bVar1) &&
         (((bVar1 = IsSingleConfigUtility(this,target), bVar1 ||
           (bVar1 = IsSingleConfigUtility(this,*(cmGeneratorTarget **)(p_Var4 + 1)),
           bVar1 || (this->CrossConfigs)._M_t._M_impl.super__Rb_tree_header._M_node_count == 0)) ||
          ((*(byte *)((long)&p_Var4[1]._M_parent + 2) | genexOutput) == 1)))) {
        config_00 = config;
        if (*(char *)((long)&p_Var4[1]._M_parent + 2) != '\0') {
          config_00 = fileConfig;
        }
        AppendTargetDependsClosure
                  (this,*(cmGeneratorTarget **)(p_Var4 + 1),
                   (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                    *)local_98,config_00,fileConfig,genexOutput,false);
      }
    }
    pmVar2 = std::
             map<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_cmGlobalNinjaGenerator::ByConfig>_>_>
             ::operator[](this_00,fileConfig);
    __pos = std::
            _Rb_tree<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>,std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,std::allocator<std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>
            ::
            _M_emplace_hint_unique<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey&,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>
                      ((_Rb_tree<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey,std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>,std::_Select1st<std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>,std::less<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey>,std::allocator<std::pair<cmGlobalNinjaGenerator::ByConfig::TargetDependsClosureKey_const,std::unordered_set<std::__cxx11::string,std::hash<std::__cxx11::string>,std::equal_to<std::__cxx11::string>,std::allocator<std::__cxx11::string>>>>>
                        *)&pmVar2->TargetDependsClosures,__pos._M_node,
                       (TargetDependsClosureKey *)local_60,
                       (unordered_set<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
                        *)local_98);
    std::
    _Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
    ::~_Hashtable((_Hashtable<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Identity,_std::equal_to<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::hash<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::__detail::_Mod_range_hashing,_std::__detail::_Default_ranged_hash,_std::__detail::_Prime_rehash_policy,_std::__detail::_Hashtable_traits<true,_true,_true>_>
                   *)local_98);
  }
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::insert<std::__detail::_Node_iterator<std::__cxx11::string,true,true>>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)outputs,
             (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )*(__node_type **)(__pos._M_node + 3),
             (_Node_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_true,_true>
              )0x0);
  local_98._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98._8_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
  local_98._16_8_ = (_Hash_node_base *)0x0;
  if (!omit_self) {
    AppendTargetOutputs(this,target,(cmNinjaDeps *)local_98,config,DependOnTargetArtifact);
  }
  std::__detail::
  _Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
  ::
  insert<__gnu_cxx::__normal_iterator<std::__cxx11::string*,std::vector<std::__cxx11::string,std::allocator<std::__cxx11::string>>>>
            ((_Insert_base<std::__cxx11::string,std::__cxx11::string,std::allocator<std::__cxx11::string>,std::__detail::_Identity,std::equal_to<std::__cxx11::string>,std::hash<std::__cxx11::string>,std::__detail::_Mod_range_hashing,std::__detail::_Default_ranged_hash,std::__detail::_Prime_rehash_policy,std::__detail::_Hashtable_traits<true,true,true>>
              *)outputs,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_98._0_8_,
             (__normal_iterator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>_>
              )local_98._8_8_);
  std::
  vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
  ::~vector((vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
             *)local_98);
  std::__cxx11::string::~string((string *)(local_60 + 8));
  return;
}

Assistant:

void cmGlobalNinjaGenerator::AppendTargetDependsClosure(
  cmGeneratorTarget const* target, std::unordered_set<std::string>& outputs,
  const std::string& config, const std::string& fileConfig, bool genexOutput,
  bool omit_self)
{

  // try to locate the target in the cache
  ByConfig::TargetDependsClosureKey key{
    target,
    config,
    genexOutput,
  };
  auto find = this->Configs[fileConfig].TargetDependsClosures.lower_bound(key);

  if (find == this->Configs[fileConfig].TargetDependsClosures.end() ||
      find->first != key) {
    // We now calculate the closure outputs by inspecting the dependent
    // targets recursively.
    // For that we have to distinguish between a local result set that is only
    // relevant for filling the cache entries properly isolated and a global
    // result set that is relevant for the result of the top level call to
    // AppendTargetDependsClosure.
    std::unordered_set<std::string>
      this_outs; // this will be the new cache entry

    for (auto const& dep_target : this->GetTargetDirectDepends(target)) {
      if (!dep_target->IsInBuildSystem()) {
        continue;
      }

      if (!this->IsSingleConfigUtility(target) &&
          !this->IsSingleConfigUtility(dep_target) &&
          this->EnableCrossConfigBuild() && !dep_target.IsCross() &&
          !genexOutput) {
        continue;
      }

      if (dep_target.IsCross()) {
        this->AppendTargetDependsClosure(dep_target, this_outs, fileConfig,
                                         fileConfig, genexOutput, false);
      } else {
        this->AppendTargetDependsClosure(dep_target, this_outs, config,
                                         fileConfig, genexOutput, false);
      }
    }
    find = this->Configs[fileConfig].TargetDependsClosures.emplace_hint(
      find, key, std::move(this_outs));
  }

  // now fill the outputs of the final result from the newly generated cache
  // entry
  outputs.insert(find->second.begin(), find->second.end());

  // finally generate the outputs of the target itself, if applicable
  cmNinjaDeps outs;
  if (!omit_self) {
    this->AppendTargetOutputs(target, outs, config, DependOnTargetArtifact);
  }
  outputs.insert(outs.begin(), outs.end());
}